

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

ethash_io_rc
ethash_io_prepare(char *dirname,ethash_h256_t seedhash,FILE **output_file,uint64_t file_size,
                 _Bool force_create)

{
  _Bool _Var1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  char *file_name;
  FILE *__stream;
  ethash_io_rc eVar5;
  uint64_t hash;
  uint64_t magic_num;
  long local_68;
  size_t local_60;
  char local_58 [40];
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  _Var1 = ethash_mkdir(dirname);
  if (!_Var1) {
    return ETHASH_IO_FAIL;
  }
  snprintf(local_58,0x22,"full-R%u-%016lx",0x17,
           (ulong)seedhash.b._0_8_ >> 0x38 | (seedhash.b._0_8_ & 0xff000000000000) >> 0x28 |
           (seedhash.b._0_8_ & 0xff0000000000) >> 0x18 | (seedhash.b._0_8_ & 0xff00000000) >> 8 |
           (seedhash.b._0_8_ & 0xff000000) << 8 | (seedhash.b._0_8_ & 0xff0000) << 0x18 |
           (seedhash.b._0_8_ & 0xff00) << 0x28 | seedhash.b._0_8_ << 0x38);
  sVar4 = strlen(local_58);
  file_name = ethash_io_create_filename(dirname,local_58,sVar4);
  if (file_name == (char *)0x0) {
    return ETHASH_IO_FAIL;
  }
  if ((force_create) || (__stream = (FILE *)ethash_fopen(file_name,"rb+"), __stream == (FILE *)0x0))
  {
    __stream = (FILE *)ethash_fopen(file_name,"wb+");
    if (__stream == (FILE *)0x0) {
      eVar5 = ETHASH_IO_FAIL;
      goto LAB_00129eab;
    }
    eVar5 = ETHASH_IO_FAIL;
    iVar2 = fseek(__stream,file_size + 7,0);
    if (((iVar2 != 0) || (iVar2 = fputc(10,__stream), iVar2 == -1)) ||
       (iVar2 = fflush(__stream), iVar2 != 0)) goto LAB_00129e68;
    eVar5 = ETHASH_IO_MEMO_MISMATCH;
  }
  else {
    _Var1 = ethash_file_size((FILE *)__stream,&local_60);
    eVar5 = ETHASH_IO_FAIL;
    if ((!_Var1) || (eVar5 = ETHASH_IO_MEMO_SIZE_MISMATCH, local_60 - 8 != file_size)) {
LAB_00129e68:
      fclose(__stream);
      goto LAB_00129eab;
    }
    sVar4 = fread(&local_68,8,1,__stream);
    if ((sVar4 != 1) || (local_68 != -0x11e215245223502)) {
      fclose(__stream);
      eVar5 = ETHASH_IO_MEMO_SIZE_MISMATCH;
      goto LAB_00129eab;
    }
    eVar5 = ETHASH_IO_MEMO_MATCH;
  }
  *output_file = (FILE *)__stream;
LAB_00129eab:
  free(file_name);
  return eVar5;
}

Assistant:

enum ethash_io_rc ethash_io_prepare(
	char const* dirname,
	ethash_h256_t const seedhash,
	FILE** output_file,
	uint64_t file_size,
	bool force_create
)
{
	char mutable_name[DAG_MUTABLE_NAME_MAX_SIZE];
	enum ethash_io_rc ret = ETHASH_IO_FAIL;
	// reset errno before io calls
	errno = 0;

	// assert directory exists
	if (!ethash_mkdir(dirname)) {
		ETHASH_CRITICAL("Could not create the ethash directory");
		goto end;
	}

	ethash_io_mutable_name(ETHASH_REVISION, &seedhash, mutable_name);
	char* tmpfile = ethash_io_create_filename(dirname, mutable_name, strlen(mutable_name));
	if (!tmpfile) {
		ETHASH_CRITICAL("Could not create the full DAG pathname");
		goto end;
	}

	FILE *f;
	if (!force_create) {
		// try to open the file
		f = ethash_fopen(tmpfile, "rb+");
		if (f) {
			size_t found_size;
			if (!ethash_file_size(f, &found_size)) {
				fclose(f);
				ETHASH_CRITICAL("Could not query size of DAG file: \"%s\"", tmpfile);
				goto free_memo;
			}
			if (file_size != found_size - ETHASH_DAG_MAGIC_NUM_SIZE) {
				fclose(f);
				ret = ETHASH_IO_MEMO_SIZE_MISMATCH;
				goto free_memo;
			}
			// compare the magic number, no need to care about endianess since it's local
			uint64_t magic_num;
			if (fread(&magic_num, ETHASH_DAG_MAGIC_NUM_SIZE, 1, f) != 1) {
				// I/O error
				fclose(f);
				ETHASH_CRITICAL("Could not read from DAG file: \"%s\"", tmpfile);
				ret = ETHASH_IO_MEMO_SIZE_MISMATCH;
				goto free_memo;
			}
			if (magic_num != ETHASH_DAG_MAGIC_NUM) {
				fclose(f);
				ret = ETHASH_IO_MEMO_SIZE_MISMATCH;
				goto free_memo;
			}
			ret = ETHASH_IO_MEMO_MATCH;
			goto set_file;
		}
	}
	
	// file does not exist, will need to be created
	f = ethash_fopen(tmpfile, "wb+");
	if (!f) {
		ETHASH_CRITICAL("Could not create DAG file: \"%s\"", tmpfile);
		goto free_memo;
	}
	// make sure it's of the proper size
	if (fseek(f, (long int)(file_size + ETHASH_DAG_MAGIC_NUM_SIZE - 1), SEEK_SET) != 0) {
		fclose(f);
		ETHASH_CRITICAL("Could not seek to the end of DAG file: \"%s\". Insufficient space?", tmpfile);
		goto free_memo;
	}
	if (fputc('\n', f) == EOF) {
		fclose(f);
		ETHASH_CRITICAL("Could not write in the end of DAG file: \"%s\". Insufficient space?", tmpfile);
		goto free_memo;
	}
	if (fflush(f) != 0) {
		fclose(f);
		ETHASH_CRITICAL("Could not flush at end of DAG file: \"%s\". Insufficient space?", tmpfile);
		goto free_memo;
	}
	ret = ETHASH_IO_MEMO_MISMATCH;
	goto set_file;

	ret = ETHASH_IO_MEMO_MATCH;
set_file:
	*output_file = f;
free_memo:
	free(tmpfile);
end:
	return ret;
}